

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::append<llvm::StringRef_const*,void>
          (SmallVectorImpl<std::__cxx11::string> *this,StringRef *in_start,StringRef *in_end)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_type NumInputs;
  StringRef *in_end_local;
  StringRef *in_start_local;
  SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  uVar2 = std::distance<llvm::StringRef_const*>(in_start,in_end);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
  if (sVar3 - sVar4 < uVar2) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::grow((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *)this,sVar3 + uVar2);
  }
  lVar1 = *(long *)this;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<std::__cxx11::string,false>::
  uninitialized_copy<llvm::StringRef_const*,std::__cxx11::string*>
            (in_start,in_end,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (lVar1 + sVar3 * 0x20));
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar3 + uVar2);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }